

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMapInfo.h
# Opt level: O0

uint __thiscall
llvm::DenseMapInfo<llvm::StringRef>::getHashValue(DenseMapInfo<llvm::StringRef> *this,StringRef Val)

{
  DenseMapInfo<llvm::StringRef> *pDVar1;
  size_t sVar2;
  StringRef S;
  hash_code local_60;
  StringRef local_58;
  StringRef local_48;
  DenseMapInfo<llvm::StringRef> *local_38;
  StringRef Val_local;
  
  Val_local.Data = Val.Data;
  local_38 = this;
  local_48 = getEmptyKey();
  pDVar1 = local_38;
  if (this == (DenseMapInfo<llvm::StringRef> *)local_48.Data) {
    __assert_fail("Val.data() != getEmptyKey().data() && \"Cannot hash the empty key!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMapInfo.h"
                  ,0x11a,
                  "static unsigned int llvm::DenseMapInfo<llvm::StringRef>::getHashValue(StringRef)"
                 );
  }
  local_58 = getTombstoneKey();
  Val_local.Length = (size_t)&local_58;
  if (pDVar1 == (DenseMapInfo<llvm::StringRef> *)local_58.Data) {
    __assert_fail("Val.data() != getTombstoneKey().data() && \"Cannot hash the tombstone key!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMapInfo.h"
                  ,0x11c,
                  "static unsigned int llvm::DenseMapInfo<llvm::StringRef>::getHashValue(StringRef)"
                 );
  }
  S.Length = Val_local.Length;
  S.Data = Val_local.Data;
  local_60 = hash_value((llvm *)local_38,S);
  sVar2 = hash_code::operator_cast_to_unsigned_long(&local_60);
  return (uint)sVar2;
}

Assistant:

static unsigned getHashValue(StringRef Val) {
    assert(Val.data() != getEmptyKey().data() && "Cannot hash the empty key!");
    assert(Val.data() != getTombstoneKey().data() &&
           "Cannot hash the tombstone key!");
    return (unsigned)(hash_value(Val));
  }